

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Serializer::SerializeMetadataInData
          (BP3Serializer *this,bool updateAbsolutePosition,bool inData)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  _func_int *p_Var9;
  uint64_t pgIndexStart;
  long lVar10;
  size_t __n;
  undefined8 *puVar11;
  long lVar12;
  size_t *position;
  size_t sVar13;
  uint64_t *puVar14;
  long lVar15;
  vector<char,_std::allocator<char>_> *buffer;
  string local_50;
  
  p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
  uVar4 = *(undefined8 *)(&(this->super_BP3Base).field_0x1a0 + (long)p_Var3);
  lVar5 = *(long *)(&(this->super_BP3Base).field_0xe8 + (long)p_Var3);
  lVar6 = *(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var3);
  uVar1 = *(undefined4 *)(&(this->super_BP3Base).field_0x140 + (long)p_Var3);
  lVar15 = 0;
  for (puVar11 = *(undefined8 **)(&(this->super_BP3Base).field_0x138 + (long)p_Var3);
      puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
    *(int *)puVar11[5] = (*(int *)(puVar11 + 6) - (int)(int *)puVar11[5]) + -4;
    lVar15 = lVar15 + (puVar11[6] - puVar11[5]);
  }
  p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
  uVar2 = *(undefined4 *)(&(this->super_BP3Base).field_0x178 + (long)p_Var3);
  lVar12 = 0;
  for (puVar11 = *(undefined8 **)(&(this->super_BP3Base).field_0x170 + (long)p_Var3);
      puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
    *(int *)puVar11[5] = (*(int *)(puVar11 + 6) - (int)(int *)puVar11[5]) + -4;
    lVar12 = lVar12 + (puVar11[6] - puVar11[5]);
  }
  if (inData) {
    __n = lVar6 - lVar5;
    p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
    lVar10 = (ulong)*(uint *)(&(this->super_BP3Base).field_0x198 + (long)p_Var3) +
             __n + lVar15 + lVar12 + 0x28;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    lVar7 = *(long *)(&(this->super_BP3Base).field_0x60 + (long)p_Var3);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50," when writing metadata in bp data buffer","");
    BufferSTL::Resize((BufferSTL *)(&(this->super_BP3Base).field_0x30 + (long)p_Var3),lVar7 + lVar10
                      ,&local_50);
    buffer = (vector<char,_std::allocator<char>_> *)
             (&(this->super_BP3Base).field_0x70 + (long)p_Var3);
    position = (size_t *)(&(this->super_BP3Base).field_0x60 + (long)p_Var3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    *(undefined8 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + *position) = uVar4;
    sVar8 = *position;
    *position = sVar8 + 8;
    *(size_t *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar8 + 8) = __n;
    sVar8 = *position;
    *position = sVar8 + 8;
    if (lVar6 != lVar5) {
      memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar8 + 8,
              *(void **)(&(this->super_BP3Base).field_0xe8 +
                        (long)(this->super_BP3Base)._vptr_BP3Base[-3]),__n);
    }
    sVar8 = *position;
    *position = sVar8 + __n;
    p_Var9 = (this->super_BP3Base)._vptr_BP3Base[-3];
    *(undefined4 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar8 + __n) = uVar1;
    sVar8 = *position;
    *position = sVar8 + 4;
    *(long *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar8 + 4) = lVar15;
    *position = *position + 8;
    for (puVar11 = *(undefined8 **)(&(this->super_BP3Base).field_0x138 + (long)p_Var9);
        puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
      sVar13 = puVar11[6] - (long)puVar11[5];
      if (sVar13 != 0) {
        memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + *position,(void *)puVar11[5],sVar13);
      }
      *position = *position + sVar13;
    }
    p_Var9 = (this->super_BP3Base)._vptr_BP3Base[-3];
    *(undefined4 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + *position) = uVar2;
    sVar8 = *position;
    *position = sVar8 + 4;
    *(long *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar8 + 4) = lVar12;
    *position = *position + 8;
    puVar14 = (uint64_t *)(&(this->super_BP3Base).field_0x68 + (long)p_Var3);
    for (puVar11 = *(undefined8 **)(&(this->super_BP3Base).field_0x170 + (long)p_Var9);
        puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
      sVar13 = puVar11[6] - (long)puVar11[5];
      if (sVar13 != 0) {
        memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + *position,(void *)puVar11[5],sVar13);
      }
      *position = *position + sVar13;
    }
    pgIndexStart = *puVar14;
    BPSerializer::PutMinifooter
              ((BPSerializer *)&(this->super_BP3Base).field_0x8,pgIndexStart,
               __n + pgIndexStart + 0x10,lVar15 + __n + pgIndexStart + 0x1c,buffer,position,false);
    if (updateAbsolutePosition) {
      *puVar14 = *puVar14 + lVar10;
    }
    p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
    if ((&(this->super_BP3Base).field_0x2e8)[(long)p_Var3] == '\x01') {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<char_const(&)[10],unsigned_long&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(&(this->super_BP3Base).field_0x2b0 + (long)p_Var3),"buffering",puVar14);
    }
  }
  return;
}

Assistant:

void BP3Serializer::SerializeMetadataInData(const bool updateAbsolutePosition, const bool inData)
{
    auto lf_SetIndexCountLength = [](std::unordered_map<std::string, SerialElementIndex> &indices,
                                     uint32_t &count, uint64_t &length) {
        count = static_cast<uint32_t>(indices.size());
        length = 0;
        for (auto &indexPair : indices) // set each index length
        {
            auto &indexBuffer = indexPair.second.Buffer;
            const uint32_t indexLength = static_cast<uint32_t>(indexBuffer.size() - 4);
            size_t indexLengthPosition = 0;
            helper::CopyToBuffer(indexBuffer, indexLengthPosition, &indexLength);

            length += indexBuffer.size(); // overall length
        }
    };

    auto lf_FlattenIndices = [](const uint32_t count, const uint64_t length,
                                const std::unordered_map<std::string, SerialElementIndex> &indices,
                                std::vector<char> &buffer, size_t &position) {
        helper::CopyToBuffer(buffer, position, &count);
        helper::CopyToBuffer(buffer, position, &length);

        for (const auto &indexPair : indices) // set each index length
        {
            const auto &indexBuffer = indexPair.second.Buffer;
            helper::CopyToBuffer(buffer, position, indexBuffer.data(), indexBuffer.size());
        }
    };

    // Finish writing metadata counts and lengths
    // PG Index
    const uint64_t pgCount = m_MetadataSet.DataPGCount;
    const uint64_t pgLength = m_MetadataSet.PGIndex.Buffer.size();

    // var index count and length (total), and each index length
    uint32_t varsCount = 0;
    uint64_t varsLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.VarsIndices, varsCount, varsLength);

    // attribute index count and length, and each index length
    uint32_t attributesCount = 0;
    uint64_t attributesLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.AttributesIndices, attributesCount, attributesLength);

    if (!inData)
    {
        return;
    }

    const size_t footerSize =
        static_cast<size_t>((pgLength + 16) + (varsLength + 12) + (attributesLength + 12) +
                            m_MetadataSet.MiniFooterSize);

    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // reserve data to fit metadata,
    // must replace with growth buffer strategy?
    m_Data.Resize(position + footerSize, " when writing metadata in bp data buffer");

    // write pg index
    helper::CopyToBuffer(buffer, position, &pgCount);
    helper::CopyToBuffer(buffer, position, &pgLength);
    helper::CopyToBuffer(buffer, position, m_MetadataSet.PGIndex.Buffer.data(),
                         static_cast<size_t>(pgLength));

    // Vars indices
    lf_FlattenIndices(varsCount, varsLength, m_MetadataSet.VarsIndices, buffer, position);
    // Attribute indices
    lf_FlattenIndices(attributesCount, attributesLength, m_MetadataSet.AttributesIndices, buffer,
                      position);

    // getting absolute offset start, minifooter is 28 bytes for now
    const uint64_t pgIndexStart = static_cast<uint64_t>(absolutePosition);
    const uint64_t variablesIndexStart = static_cast<uint64_t>(pgIndexStart + (pgLength + 16));
    const uint64_t attributesIndexStart =
        static_cast<uint64_t>(variablesIndexStart + (varsLength + 12));

    PutMinifooter(pgIndexStart, variablesIndexStart, attributesIndexStart, buffer, position);

    if (updateAbsolutePosition)
    {
        absolutePosition += footerSize;
    }

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.emplace("buffering", absolutePosition);
    }
}